

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

int __thiscall
CS248::OSDText::add_line(OSDText *this,float x,float y,string *text,size_t size,Color color)

{
  undefined4 uVar1;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  size_t local_38;
  Color CStack_30;
  
  local_48._8_8_ = 0;
  local_38 = 0;
  sStack_50 = 0;
  local_48._M_allocated_capacity = 0;
  CStack_30.r = 0.0;
  CStack_30.g = 0.0;
  CStack_30.b = 0.0;
  CStack_30.a = 1.0;
  local_68._0_4_ = 0;
  local_68._12_4_ = 0;
  local_68._8_4_ = y;
  local_58._M_p = (pointer)&local_48;
  local_68._4_4_ = x;
  std::__cxx11::string::_M_assign((string *)&local_58);
  CStack_30._8_8_ = color._8_8_;
  local_38 = size;
  if (this->use_hdpi == true) {
    local_38 = size * 2;
  }
  local_68._0_4_ = this->next_id;
  this->next_id = this->next_id + 1;
  CStack_30._0_8_ = color._0_8_;
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::push_back
            (&this->lines,(value_type *)local_68);
  uVar1 = local_68._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p);
  }
  return uVar1;
}

Assistant:

int OSDText::add_line(float x, float y, string text,
                      size_t size, Color color) {
  // create new line
  OSDLine new_line = OSDLine();
  new_line.x = x;
  new_line.y = y;
  new_line.text = text;
  new_line.size = size;
  new_line.color = color;

  // handle HDPI display
  if (use_hdpi) new_line.size *= 2;

  // update id
  new_line.id = next_id;
  next_id++;

  // add line
  lines.push_back(new_line);
  return new_line.id;
}